

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSphereShape.cpp
# Opt level: O2

void __thiscall
btSphereShape::getAabb(btSphereShape *this,btTransform *t,btVector3 *aabbMin,btVector3 *aabbMax)

{
  btVector3 bVar1;
  btVector3 extent;
  btVector3 local_30;
  
  (*(this->super_btConvexInternalShape).super_btConvexShape.super_btCollisionShape.
    _vptr_btCollisionShape[0xc])();
  (*(this->super_btConvexInternalShape).super_btConvexShape.super_btCollisionShape.
    _vptr_btCollisionShape[0xc])(this);
  (*(this->super_btConvexInternalShape).super_btConvexShape.super_btCollisionShape.
    _vptr_btCollisionShape[0xc])(this);
  local_30.m_floats[3] = 0.0;
  bVar1 = operator-(&t->m_origin,&local_30);
  *(btVector3 *)aabbMin->m_floats = bVar1;
  bVar1 = operator+(&t->m_origin,&local_30);
  *(btVector3 *)aabbMax->m_floats = bVar1;
  return;
}

Assistant:

void btSphereShape::getAabb(const btTransform& t,btVector3& aabbMin,btVector3& aabbMax) const
{
	const btVector3& center = t.getOrigin();
	btVector3 extent(getMargin(),getMargin(),getMargin());
	aabbMin = center - extent;
	aabbMax = center + extent;
}